

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&,_bool)> *work)

{
  Runtime rt;
  
  rt._preempted = false;
  rt._executor = this;
  rt._worker = worker;
  rt._parent = node;
  if (((uint)node->_nstate >> 0x1d & 1) == 0) {
    _observer_prologue(this,worker,node);
    std::function<void_(tf::Runtime_&,_bool)>::operator()(work,&rt,false);
    _observer_epilogue(this,worker,node);
    if (rt._preempted != false) {
      return true;
    }
  }
  else {
    node->_nstate = node->_nstate & 0xdfffffff;
  }
  std::function<void_(tf::Runtime_&,_bool)>::operator()(work,&rt,true);
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&, bool)>& work
) {
    
  Runtime rt(*this, worker, node);

  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt, false);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    // Ex: if preempted, another task may finish real quck and insert this parent task
    // again into the scheduling queue. When running this parent task, it will jump to
    // else branch below and modify tne nstate, thus incuring data race.
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }

  // clean up outstanding work
  work(rt, true);

  return false;
}